

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

void __thiscall TinyProcessLib::Process::~Process(Process *this)

{
  close_fds(this);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&this->stdin_fd);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&this->stderr_fd);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&this->stdout_fd);
  std::thread::~thread(&this->stdout_stderr_thread);
  std::_Function_base::~_Function_base(&(this->read_stderr).super__Function_base);
  std::_Function_base::~_Function_base(&(this->read_stdout).super__Function_base);
  return;
}

Assistant:

Process::~Process() noexcept {
  close_fds();
}